

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UI.cpp
# Opt level: O2

void __thiscall UI::setNodeProperties(UI *this,Vertex<std::pair<double,_double>_> *node,int id)

{
  GraphViewer *pGVar1;
  string *this_00;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  switch(node->tag) {
  case quinta:
    GraphViewer::setVertexSize(this->gv,id,10);
    pGVar1 = this->gv;
    std::__cxx11::string::string((string *)&local_30,"BLUE",&local_91);
    GraphViewer::setVertexColor(pGVar1,id,&local_30);
    this_00 = &local_30;
    break;
  case garagem:
    GraphViewer::setVertexSize(this->gv,id,10);
    pGVar1 = this->gv;
    std::__cxx11::string::string((string *)&local_50,"ORANGE",&local_91);
    GraphViewer::setVertexColor(pGVar1,id,&local_50);
    this_00 = &local_50;
    break;
  case cliente:
    GraphViewer::setVertexSize(this->gv,id,10);
    pGVar1 = this->gv;
    std::__cxx11::string::string((string *)&local_70,"RED",&local_91);
    GraphViewer::setVertexColor(pGVar1,id,&local_70);
    this_00 = &local_70;
    break;
  case none:
    GraphViewer::setVertexSize(this->gv,id,3);
    pGVar1 = this->gv;
    std::__cxx11::string::string((string *)&local_90,"YELLOW",&local_91);
    GraphViewer::setVertexColor(pGVar1,id,&local_90);
    this_00 = &local_90;
    break;
  default:
    goto switchD_00110157_default;
  }
  std::__cxx11::string::~string((string *)this_00);
switchD_00110157_default:
  return;
}

Assistant:

void UI::setNodeProperties(Vertex<coordinates> *node, int id) {
    switch (node->tag) {
        case quinta:
            gv->setVertexSize(id, 10);
            gv->setVertexColor(id, "BLUE");
            break;
        case garagem:
            gv->setVertexSize(id, 10);
            gv->setVertexColor(id, "ORANGE");
            break;
        case cliente:
            gv->setVertexSize(id, 10);
            gv->setVertexColor(id, "RED");
            break;
        case none:
            gv->setVertexSize(id, 3);
            gv->setVertexColor(id, "YELLOW");
            break;
    }
}